

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnWriter::CompressPage
          (ColumnWriter *this,MemoryStream *temp_writer,size_t *compressed_size,
          data_ptr_t *compressed_data,AllocatedData *compressed_buf)

{
  void *dst;
  int iVar1;
  data_ptr_t pdVar2;
  size_t sVar3;
  void *src;
  size_t srcSize;
  idx_t iVar4;
  char *src_00;
  ulong uVar5;
  char *pcVar6;
  uint8_t *input_buffer;
  unsigned_long params;
  InternalException *pIVar7;
  MiniZStream s;
  Allocator local_48 [24];
  
  switch(this->writer->codec) {
  case UNCOMPRESSED:
    sVar3 = duckdb::MemoryStream::GetPosition();
    *compressed_size = sVar3;
    pdVar2 = (data_ptr_t)duckdb::MemoryStream::GetData();
    goto LAB_0029d4b0;
  case SNAPPY:
    sVar3 = duckdb::MemoryStream::GetPosition();
    sVar3 = duckdb_snappy::MaxCompressedLength(sVar3);
    *compressed_size = sVar3;
    iVar4 = duckdb::BufferAllocator::Get(this->writer->context);
    Allocator::Allocate((Allocator *)&s,iVar4);
    duckdb::AllocatedData::operator=(compressed_buf,(AllocatedData *)&s);
    duckdb::AllocatedData::~AllocatedData((AllocatedData *)&s);
    pcVar6 = (char *)duckdb::MemoryStream::GetData();
    sVar3 = duckdb::MemoryStream::GetPosition();
    duckdb_snappy::RawCompress(pcVar6,sVar3,*(char **)(compressed_buf + 8),compressed_size);
    pdVar2 = *(data_ptr_t *)(compressed_buf + 8);
LAB_0029d4b0:
    *compressed_data = pdVar2;
    break;
  case GZIP:
    s.stream.adler = 0;
    s.stream.reserved = 0;
    s.stream.opaque = (void *)0x0;
    s.stream.data_type = 0;
    s.stream._92_4_ = 0;
    s.stream.zalloc = (mz_alloc_func)0x0;
    s.stream.zfree = (mz_free_func)0x0;
    s.stream.msg = (char *)0x0;
    s.stream.state = (mz_internal_state *)0x0;
    s.stream.avail_out = 0;
    s.stream._36_4_ = 0;
    s.stream.total_out = 0;
    s.stream.total_in = 0;
    s.stream.next_out = (uchar *)0x0;
    s.stream.next_in = (uchar *)0x0;
    s.stream.avail_in = 0;
    s.stream._12_4_ = 0;
    s.type = MINIZ_TYPE_NONE;
    sVar3 = duckdb::MemoryStream::GetPosition();
    sVar3 = MiniZStream::MaxCompressedLength(sVar3);
    *compressed_size = sVar3;
    iVar4 = duckdb::BufferAllocator::Get(this->writer->context);
    Allocator::Allocate(local_48,iVar4);
    duckdb::AllocatedData::operator=(compressed_buf,(AllocatedData *)local_48);
    duckdb::AllocatedData::~AllocatedData((AllocatedData *)local_48);
    pcVar6 = (char *)duckdb::MemoryStream::GetData();
    sVar3 = duckdb::MemoryStream::GetPosition();
    MiniZStream::Compress(&s,pcVar6,sVar3,*(char **)(compressed_buf + 8),compressed_size);
    *compressed_data = *(data_ptr_t *)(compressed_buf + 8);
    MiniZStream::~MiniZStream(&s);
    break;
  default:
    pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&s,"Unsupported codec for Parquet Writer",(allocator *)local_48);
    duckdb::InternalException::InternalException(pIVar7,(string *)&s);
    __cxa_throw(pIVar7,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  case BROTLI:
    sVar3 = duckdb::MemoryStream::GetPosition();
    sVar3 = duckdb_brotli::BrotliEncoderMaxCompressedSize(sVar3);
    *compressed_size = sVar3;
    iVar4 = duckdb::BufferAllocator::Get(this->writer->context);
    Allocator::Allocate((Allocator *)&s,iVar4);
    duckdb::AllocatedData::operator=(compressed_buf,(AllocatedData *)&s);
    duckdb::AllocatedData::~AllocatedData((AllocatedData *)&s);
    sVar3 = duckdb::MemoryStream::GetPosition();
    input_buffer = (uint8_t *)duckdb::MemoryStream::GetData();
    duckdb_brotli::BrotliEncoderCompress
              (0xb,0x16,BROTLI_MODE_GENERIC,sVar3,input_buffer,compressed_size,
               *(uint8_t **)(compressed_buf + 8));
    *compressed_data = *(data_ptr_t *)(compressed_buf + 8);
    break;
  case ZSTD:
    sVar3 = duckdb::MemoryStream::GetPosition();
    sVar3 = duckdb_zstd::ZSTD_compressBound(sVar3);
    *compressed_size = sVar3;
    iVar4 = duckdb::BufferAllocator::Get(this->writer->context);
    Allocator::Allocate((Allocator *)&s,iVar4);
    duckdb::AllocatedData::operator=(compressed_buf,(AllocatedData *)&s);
    duckdb::AllocatedData::~AllocatedData((AllocatedData *)&s);
    dst = *(void **)(compressed_buf + 8);
    sVar3 = *compressed_size;
    src = (void *)duckdb::MemoryStream::GetData();
    srcSize = duckdb::MemoryStream::GetPosition();
    uVar5 = duckdb_zstd::ZSTD_compress(dst,sVar3,src,srcSize,(int)this->writer->compression_level);
    *compressed_size = uVar5;
    *compressed_data = *(data_ptr_t *)(compressed_buf + 8);
    goto LAB_0029d67e;
  case LZ4_RAW:
    iVar1 = duckdb::MemoryStream::GetPosition();
    iVar1 = duckdb_lz4::LZ4_compressBound(iVar1);
    *compressed_size = (long)iVar1;
    iVar4 = duckdb::BufferAllocator::Get(this->writer->context);
    Allocator::Allocate((Allocator *)&s,iVar4);
    duckdb::AllocatedData::operator=(compressed_buf,(AllocatedData *)&s);
    duckdb::AllocatedData::~AllocatedData((AllocatedData *)&s);
    src_00 = (char *)duckdb::MemoryStream::GetData();
    pcVar6 = *(char **)(compressed_buf + 8);
    iVar1 = duckdb::MemoryStream::GetPosition();
    iVar1 = duckdb_lz4::LZ4_compress_default(src_00,pcVar6,iVar1,(int)*compressed_size);
    uVar5 = (ulong)iVar1;
    *compressed_size = uVar5;
    *compressed_data = *(data_ptr_t *)(compressed_buf + 8);
    goto LAB_0029d67e;
  }
  uVar5 = *compressed_size;
LAB_0029d67e:
  if (uVar5 >> 0x1f == 0) {
    return;
  }
  pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&s,"Parquet writer: %d compressed page size out of range for type integer",
             (allocator *)local_48);
  params = duckdb::MemoryStream::GetPosition();
  InternalException::InternalException<unsigned_long>(pIVar7,(string *)&s,params);
  __cxa_throw(pIVar7,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ColumnWriter::CompressPage(MemoryStream &temp_writer, size_t &compressed_size, data_ptr_t &compressed_data,
                                AllocatedData &compressed_buf) {
	switch (writer.GetCodec()) {
	case CompressionCodec::UNCOMPRESSED:
		compressed_size = temp_writer.GetPosition();
		compressed_data = temp_writer.GetData();
		break;

	case CompressionCodec::SNAPPY: {
		compressed_size = duckdb_snappy::MaxCompressedLength(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		duckdb_snappy::RawCompress(const_char_ptr_cast(temp_writer.GetData()), temp_writer.GetPosition(),
		                           char_ptr_cast(compressed_buf.get()), &compressed_size);
		compressed_data = compressed_buf.get();
		D_ASSERT(compressed_size <= duckdb_snappy::MaxCompressedLength(temp_writer.GetPosition()));
		break;
	}
	case CompressionCodec::LZ4_RAW: {
		compressed_size = duckdb_lz4::LZ4_compressBound(UnsafeNumericCast<int32_t>(temp_writer.GetPosition()));
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		compressed_size = duckdb_lz4::LZ4_compress_default(
		    const_char_ptr_cast(temp_writer.GetData()), char_ptr_cast(compressed_buf.get()),
		    UnsafeNumericCast<int32_t>(temp_writer.GetPosition()), UnsafeNumericCast<int32_t>(compressed_size));
		compressed_data = compressed_buf.get();
		break;
	}
	case CompressionCodec::GZIP: {
		MiniZStream s;
		compressed_size = s.MaxCompressedLength(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		s.Compress(const_char_ptr_cast(temp_writer.GetData()), temp_writer.GetPosition(),
		           char_ptr_cast(compressed_buf.get()), &compressed_size);
		compressed_data = compressed_buf.get();
		break;
	}
	case CompressionCodec::ZSTD: {
		compressed_size = duckdb_zstd::ZSTD_compressBound(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		compressed_size = duckdb_zstd::ZSTD_compress((void *)compressed_buf.get(), compressed_size,
		                                             (const void *)temp_writer.GetData(), temp_writer.GetPosition(),
		                                             UnsafeNumericCast<int32_t>(writer.CompressionLevel()));
		compressed_data = compressed_buf.get();
		break;
	}
	case CompressionCodec::BROTLI: {
		compressed_size = duckdb_brotli::BrotliEncoderMaxCompressedSize(temp_writer.GetPosition());
		compressed_buf = BufferAllocator::Get(writer.GetContext()).Allocate(compressed_size);
		duckdb_brotli::BrotliEncoderCompress(BROTLI_DEFAULT_QUALITY, BROTLI_DEFAULT_WINDOW, BROTLI_DEFAULT_MODE,
		                                     temp_writer.GetPosition(), temp_writer.GetData(), &compressed_size,
		                                     compressed_buf.get());
		compressed_data = compressed_buf.get();
		break;
	}
	default:
		throw InternalException("Unsupported codec for Parquet Writer");
	}

	if (compressed_size > idx_t(NumericLimits<int32_t>::Maximum())) {
		throw InternalException("Parquet writer: %d compressed page size out of range for type integer",
		                        temp_writer.GetPosition());
	}
}